

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::ICUDataTable::get
          (ICUDataTable *this,char *tableKey,char *subTableKey,char *itemKey,UnicodeString *result)

{
  short sVar1;
  int32_t srcLength;
  UChar *srcChars;
  UnicodeString *pUVar2;
  int32_t length;
  int32_t len;
  UErrorCode status;
  int32_t local_78;
  UErrorCode local_74;
  UnicodeString local_70;
  
  local_74 = U_ZERO_ERROR;
  local_78 = 0;
  srcChars = uloc_getTableStringWithFallback_63
                       (this->path,(this->locale).fullName,tableKey,subTableKey,itemKey,&local_78,
                        &local_74);
  srcLength = local_78;
  if (local_78 < 1 || U_ZERO_ERROR < local_74) {
    UnicodeString::UnicodeString(&local_70,itemKey,-1,kInvariant);
    pUVar2 = UnicodeString::copyFrom(result,&local_70,'\0');
    UnicodeString::~UnicodeString(&local_70);
  }
  else {
    UnicodeString::unBogus(result);
    sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (result->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    pUVar2 = UnicodeString::doReplace(result,0,length,srcChars,0,srcLength);
  }
  return pUVar2;
}

Assistant:

UnicodeString &
ICUDataTable::get(const char* tableKey, const char* subTableKey, const char* itemKey,
                  UnicodeString &result) const {
  UErrorCode status = U_ZERO_ERROR;
  int32_t len = 0;

  const UChar *s = uloc_getTableStringWithFallback(path, locale.getName(),
                                                   tableKey, subTableKey, itemKey,
                                                   &len, &status);
  if (U_SUCCESS(status) && len > 0) {
    return result.setTo(s, len);
  }
  return result.setTo(UnicodeString(itemKey, -1, US_INV));
}